

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O0

bool __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::deep_equal
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_expression_interface<double> *other)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  rt_expression_interface<double> *prVar4;
  element_type *peVar5;
  op_interface_type *poVar6;
  byte local_51;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *local_50;
  long local_40;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *temp;
  rt_expression_interface<double> *other_local;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  if (other == (rt_expression_interface<double> *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast(other,&rt_expression_interface<double>::typeinfo,
                              &rt_binary_expr<viennamath::rt_expression_interface<double>>::typeinfo
                              ,0);
  }
  if (local_40 == 0) {
    this_local._7_1_ = false;
  }
  else {
    if (other == (rt_expression_interface<double> *)0x0) {
      local_50 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)0x0;
    }
    else {
      local_50 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)
                 __dynamic_cast(other,&rt_expression_interface<double>::typeinfo,
                                &rt_binary_expr<viennamath::rt_expression_interface<double>>::
                                 typeinfo,0);
    }
    peVar3 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->lhs_);
    prVar4 = lhs(local_50);
    uVar1 = (*peVar3->_vptr_rt_expression_interface[0xb])(peVar3,prVar4);
    local_51 = 0;
    if ((uVar1 & 1) != 0) {
      peVar5 = std::
               auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>::
               operator->(&this->op_);
      poVar6 = op(local_50);
      uVar1 = (*peVar5->_vptr_op_interface[0xc])(peVar5,poVar6);
      local_51 = 0;
      if ((uVar1 & 1) != 0) {
        peVar3 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->
                           (&this->rhs_);
        prVar4 = rhs(local_50);
        iVar2 = (*peVar3->_vptr_rt_expression_interface[0xb])(peVar3,prVar4);
        local_51 = (byte)iVar2;
      }
    }
    this_local._7_1_ = (bool)(local_51 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool deep_equal(const InterfaceType * other) const
      {
        if (dynamic_cast< const rt_binary_expr * >(other) != NULL)
        {
          const rt_binary_expr * temp = dynamic_cast< const rt_binary_expr * >(other);
          return lhs_->deep_equal(temp->lhs())
                 && op_->equal(temp->op())
                 && rhs_->deep_equal(temp->rhs());
        }
        return false;
        //return lhs_->deep_equal(other) && rhs_->deep_equal(other);
      }